

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemTranslate(Mem *pMem,u8 desiredEnc)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  ushort *puVar6;
  byte *p;
  byte *pbVar7;
  ushort *puVar8;
  long lVar9;
  uint uVar10;
  undefined7 in_register_00000031;
  byte *pbVar11;
  ushort *puVar12;
  uint uVar13;
  
  if (((int)CONCAT71(in_register_00000031,desiredEnc) == 1) || (pMem->enc == '\x01')) {
    uVar13 = pMem->n;
    if (desiredEnc == '\x01') {
      uVar13 = uVar13 & 0xfffffffe;
      pMem->n = uVar13;
      iVar5 = uVar13 * 2 + 1;
    }
    else {
      iVar5 = uVar13 * 2 + 2;
    }
    puVar6 = (ushort *)pMem->z;
    p = (byte *)sqlite3DbMallocRaw(pMem->db,(long)iVar5);
    if (p == (byte *)0x0) {
      return 7;
    }
    puVar8 = (ushort *)((long)(int)uVar13 + (long)puVar6);
    if (pMem->enc == '\x01') {
      pbVar7 = p;
      if (desiredEnc == '\x02') {
        while (puVar6 < puVar8) {
          bVar2 = (byte)*puVar6;
          puVar12 = (ushort *)((long)puVar6 + 1);
          puVar6 = puVar12;
          uVar13 = (uint)bVar2;
          if (bVar2 < 0xc0) {
LAB_00126c8c:
            *(short *)pbVar7 = (short)uVar13;
            pbVar7 = pbVar7 + 2;
          }
          else {
            uVar10 = (uint)""[bVar2 - 0xc0];
            while ((puVar6 = puVar8, puVar12 != puVar8 &&
                   (uVar3 = *puVar12, puVar6 = puVar12, ((byte)uVar3 & 0xffffffc0) == 0x80))) {
              puVar12 = (ushort *)((long)puVar12 + 1);
              uVar10 = uVar10 << 6 | (byte)uVar3 & 0x3f;
            }
            uVar13 = 0xfffd;
            if (((((uVar10 & 0xfffffffe) == 0xfffe) || (uVar10 < 0x80)) ||
                ((uVar10 & 0xfffff800) == 0xd800)) || (uVar13 = uVar10, uVar10 < 0x10000))
            goto LAB_00126c8c;
            *pbVar7 = (byte)(uVar10 - 0x10000 >> 10) & 0xc0 | (byte)(uVar10 >> 10) & 0x3f;
            pbVar7[1] = (byte)(uVar10 - 0x10000 >> 0x12) & 3 | 0xd8;
            pbVar7[2] = (byte)uVar10;
            pbVar7[3] = (byte)(uVar10 >> 8) & 3 | 0xdc;
            pbVar7 = pbVar7 + 4;
          }
        }
      }
      else {
        while (puVar6 < puVar8) {
          bVar2 = (byte)*puVar6;
          puVar12 = (ushort *)((long)puVar6 + 1);
          puVar6 = puVar12;
          uVar13 = (uint)bVar2;
          if (bVar2 < 0xc0) {
LAB_00126eb4:
            uVar10 = uVar13;
            pbVar11 = pbVar7 + 1;
            *pbVar7 = (byte)(uVar10 >> 8);
            lVar9 = 2;
          }
          else {
            uVar10 = (uint)""[bVar2 - 0xc0];
            while ((puVar6 = puVar8, puVar12 != puVar8 &&
                   (uVar3 = *puVar12, puVar6 = puVar12, ((byte)uVar3 & 0xffffffc0) == 0x80))) {
              puVar12 = (ushort *)((long)puVar12 + 1);
              uVar10 = uVar10 << 6 | (byte)uVar3 & 0x3f;
            }
            uVar13 = 0xfffd;
            if ((((uVar10 & 0xfffffffe) == 0xfffe) || (uVar10 < 0x80)) ||
               (((uVar10 & 0xfffff800) == 0xd800 || (uVar13 = uVar10, uVar10 < 0x10000))))
            goto LAB_00126eb4;
            *pbVar7 = (byte)(uVar10 - 0x10000 >> 0x12) & 3 | 0xd8;
            pbVar7[1] = (byte)(uVar10 - 0x10000 >> 10) & 0xc0 | (byte)(uVar10 >> 10) & 0x3f;
            pbVar11 = pbVar7 + 3;
            pbVar7[2] = (byte)(uVar10 >> 8) & 3 | 0xdc;
            lVar9 = 4;
          }
          pbVar7 = pbVar7 + lVar9;
          *pbVar11 = (byte)uVar10;
        }
      }
      pMem->n = (int)pbVar7 - (int)p;
      *pbVar7 = 0;
      pbVar7 = pbVar7 + 1;
    }
    else {
      pbVar7 = p;
      if (pMem->enc == '\x02') {
        while (puVar6 < puVar8) {
          bVar2 = (byte)*puVar6;
          puVar12 = puVar6 + 1;
          bVar1 = *(byte *)((long)puVar6 + 1);
          uVar3 = *puVar6;
          if (((bVar1 & 0xf8) == 0xd8) && (puVar12 < puVar8)) {
            uVar4 = puVar6[1];
            bVar1 = *(byte *)((long)puVar6 + 3);
            iVar5 = (uVar3 & 0x3c0) * 0x400;
            *pbVar7 = (byte)(iVar5 + 0x10000U >> 0x12) | 0xf0;
            pbVar7[1] = (byte)(iVar5 + ((uint)bVar2 << 10 & 0xf000) + 0x10000 >> 0xc) & 0x3f | 0x80;
            pbVar7[2] = (byte)(((bVar1 & 3) << 8 | (uint)(byte)uVar4 | (uint)bVar2 << 10) >> 6) &
                        0x3f | 0x80;
            pbVar7[3] = (byte)uVar4 & 0x3f | 0x80;
            pbVar7 = pbVar7 + 4;
            puVar6 = puVar6 + 2;
          }
          else {
            puVar6 = puVar12;
            if (uVar3 < 0x80) {
              *pbVar7 = bVar2;
              pbVar7 = pbVar7 + 1;
            }
            else if (bVar1 < 8) {
              *pbVar7 = (byte)(uVar3 >> 6) | 0xc0;
              pbVar7[1] = bVar2 & 0x3f | 0x80;
              pbVar7 = pbVar7 + 2;
            }
            else {
              *pbVar7 = bVar1 >> 4 | 0xe0;
              pbVar7[1] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
              pbVar7[2] = bVar2 & 0x3f | 0x80;
              pbVar7 = pbVar7 + 3;
            }
          }
        }
      }
      else {
        while (puVar6 < puVar8) {
          bVar2 = (byte)*puVar6;
          puVar12 = puVar6 + 1;
          bVar1 = *(byte *)((long)puVar6 + 1);
          uVar3 = CONCAT11(bVar2,bVar1);
          if (((bVar2 & 0xf8) == 0xd8) && (puVar12 < puVar8)) {
            uVar4 = puVar6[1];
            bVar2 = *(byte *)((long)puVar6 + 3);
            iVar5 = (uVar3 & 0x3c0) * 0x400;
            *pbVar7 = (byte)(iVar5 + 0x10000U >> 0x12) | 0xf0;
            pbVar7[1] = (byte)(iVar5 + ((uint)bVar1 << 10 & 0xf000) + 0x10000 >> 0xc) & 0x3f | 0x80;
            pbVar7[2] = (byte)((((byte)uVar4 & 3) << 8 | (uint)bVar2 | (uint)bVar1 << 10) >> 6) &
                        0x3f | 0x80;
            pbVar7[3] = bVar2 & 0x3f | 0x80;
            pbVar7 = pbVar7 + 4;
            puVar6 = puVar6 + 2;
          }
          else {
            puVar6 = puVar12;
            if (uVar3 < 0x80) {
              *pbVar7 = bVar1;
              pbVar7 = pbVar7 + 1;
            }
            else if (bVar2 < 8) {
              *pbVar7 = (byte)(uVar3 >> 6) | 0xc0;
              pbVar7[1] = bVar1 & 0x3f | 0x80;
              pbVar7 = pbVar7 + 2;
            }
            else {
              *pbVar7 = bVar2 >> 4 | 0xe0;
              pbVar7[1] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
              pbVar7[2] = bVar1 & 0x3f | 0x80;
              pbVar7 = pbVar7 + 3;
            }
          }
        }
      }
      pMem->n = (int)pbVar7 - (int)p;
    }
    *pbVar7 = 0;
    uVar3 = pMem->flags;
    sqlite3VdbeMemRelease(pMem);
    pMem->flags = uVar3 & 0x1d | 0x202;
    pMem->enc = desiredEnc;
    pMem->z = (char *)p;
    pMem->zMalloc = (char *)p;
    iVar5 = sqlite3DbMallocSize(pMem->db,p);
    pMem->szMalloc = iVar5;
  }
  else {
    iVar5 = sqlite3VdbeMemMakeWriteable(pMem);
    if (iVar5 != 0) {
      return 7;
    }
    puVar6 = (ushort *)pMem->z;
    puVar8 = (ushort *)(((long)pMem->n & 0xfffffffffffffffeU) + (long)puVar6);
    for (; puVar6 < puVar8; puVar6 = puVar6 + 1) {
      *puVar6 = *puVar6 << 8 | *puVar6 >> 8;
    }
    pMem->enc = desiredEnc;
  }
  return 0;
}

Assistant:

int sqlite3VdbeMemTranslate(Mem *pMem, u8 desiredEnc){
  int len;                    /* Maximum length of output string in bytes */
  unsigned char *zOut;                  /* Output buffer */
  unsigned char *zIn;                   /* Input iterator */
  unsigned char *zTerm;                 /* End of input */
  unsigned char *z;                     /* Output iterator */
  unsigned int c;

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( pMem->flags&MEM_Str );
  assert( pMem->enc!=desiredEnc );
  assert( pMem->enc!=0 );
  assert( pMem->n>=0 );

#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    char zBuf[100];
    sqlite3VdbeMemPrettyPrint(pMem, zBuf);
    fprintf(stderr, "INPUT:  %s\n", zBuf);
  }
#endif

  /* If the translation is between UTF-16 little and big endian, then 
  ** all that is required is to swap the byte order. This case is handled
  ** differently from the others.
  */
  if( pMem->enc!=SQLITE_UTF8 && desiredEnc!=SQLITE_UTF8 ){
    u8 temp;
    int rc;
    rc = sqlite3VdbeMemMakeWriteable(pMem);
    if( rc!=SQLITE_OK ){
      assert( rc==SQLITE_NOMEM );
      return SQLITE_NOMEM;
    }
    zIn = (u8*)pMem->z;
    zTerm = &zIn[pMem->n&~1];
    while( zIn<zTerm ){
      temp = *zIn;
      *zIn = *(zIn+1);
      zIn++;
      *zIn++ = temp;
    }
    pMem->enc = desiredEnc;
    goto translate_out;
  }

  /* Set len to the maximum number of bytes required in the output buffer. */
  if( desiredEnc==SQLITE_UTF8 ){
    /* When converting from UTF-16, the maximum growth results from
    ** translating a 2-byte character to a 4-byte UTF-8 character.
    ** A single byte is required for the output string
    ** nul-terminator.
    */
    pMem->n &= ~1;
    len = pMem->n * 2 + 1;
  }else{
    /* When converting from UTF-8 to UTF-16 the maximum growth is caused
    ** when a 1-byte UTF-8 character is translated into a 2-byte UTF-16
    ** character. Two bytes are required in the output buffer for the
    ** nul-terminator.
    */
    len = pMem->n * 2 + 2;
  }

  /* Set zIn to point at the start of the input buffer and zTerm to point 1
  ** byte past the end.
  **
  ** Variable zOut is set to point at the output buffer, space obtained
  ** from sqlite3_malloc().
  */
  zIn = (u8*)pMem->z;
  zTerm = &zIn[pMem->n];
  zOut = sqlite3DbMallocRaw(pMem->db, len);
  if( !zOut ){
    return SQLITE_NOMEM;
  }
  z = zOut;

  if( pMem->enc==SQLITE_UTF8 ){
    if( desiredEnc==SQLITE_UTF16LE ){
      /* UTF-8 -> UTF-16 Little-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16LE(z, c);
      }
    }else{
      assert( desiredEnc==SQLITE_UTF16BE );
      /* UTF-8 -> UTF-16 Big-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16BE(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
    *z++ = 0;
  }else{
    assert( desiredEnc==SQLITE_UTF8 );
    if( pMem->enc==SQLITE_UTF16LE ){
      /* UTF-16 Little-endian -> UTF-8 */
      while( zIn<zTerm ){
        READ_UTF16LE(zIn, zIn<zTerm, c); 
        WRITE_UTF8(z, c);
      }
    }else{
      /* UTF-16 Big-endian -> UTF-8 */
      while( zIn<zTerm ){
        READ_UTF16BE(zIn, zIn<zTerm, c); 
        WRITE_UTF8(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
  }
  *z = 0;
  assert( (pMem->n+(desiredEnc==SQLITE_UTF8?1:2))<=len );

  c = pMem->flags;
  sqlite3VdbeMemRelease(pMem);
  pMem->flags = MEM_Str|MEM_Term|(c&MEM_AffMask);
  pMem->enc = desiredEnc;
  pMem->z = (char*)zOut;
  pMem->zMalloc = pMem->z;
  pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->z);

translate_out:
#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    char zBuf[100];
    sqlite3VdbeMemPrettyPrint(pMem, zBuf);
    fprintf(stderr, "OUTPUT: %s\n", zBuf);
  }
#endif
  return SQLITE_OK;
}